

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

void deqp::gls::anon_unknown_1::bindAttributes
               (TestLog *log,Functions *gl,deUint32 program,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *binds)

{
  ostringstream *this;
  GLenum err;
  pointer pBVar1;
  undefined1 local_1b0 [384];
  
  pBVar1 = (binds->
           super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (binds->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    this = (ostringstream *)(local_1b0 + 8);
    do {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Bind attribute: \'",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(pBVar1->m_attribute)._M_dataplus._M_p,
                 (pBVar1->m_attribute)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\' to ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      (*gl->bindAttribLocation)(program,pBVar1->m_location,(pBVar1->m_attribute)._M_dataplus._M_p);
      err = (*gl->getError)();
      glu::checkError(err,"glBindAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x1df);
      pBVar1 = pBVar1 + 1;
    } while (pBVar1 != (binds->
                       super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

PreLinkBindAttributeTest::PreLinkBindAttributeTest (tcu::TestContext&	testCtx,
													glu::RenderContext&	renderCtx)
	: TestCase		(testCtx, "pre_link", "pre_link")
	, m_renderCtx	(renderCtx)
{
}